

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdConfigDirWrapper.cpp
# Opt level: O1

bool __thiscall LdConfigDirWrapper::wrap(LdConfigDirWrapper *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
    super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x2c])();
  iVar1 = (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
            super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xc])(this);
  if (CONCAT44(extraout_var,iVar1) != 0) {
    wrapSubentriesTable(this,0x12,0x13);
    wrapSubentriesTable(this,0x16,0x17);
    wrapSubentriesTable(this,0x1f,0x20);
    wrapSubentriesTable(this,0x1d,0x1e);
    wrapSubentriesTable(this,0x2d,0x2e);
  }
  return CONCAT44(extraout_var,iVar1) != 0;
}

Assistant:

bool LdConfigDirWrapper::wrap()
{
    clear();
    if (!getPtr()) return false;
    //SEHandlerTable:
    wrapSubentriesTable(SEH_TABLE, SEH_COUNT);
    
    //GuardCFFunctionTable:
    wrapSubentriesTable(GUARD_TABLE, GUARD_COUNT);
    
    wrapSubentriesTable(GUARD_LONG_JUMP_TABLE, GUARD_LONG_JUMP_COUNT);
    wrapSubentriesTable(GUARD_ADDR_IAT_ENTRY_TABLE, GUARD_ADDR_IAT_ENTRY_COUNT);
    
    wrapSubentriesTable(GUARD_EH_CONT_TABLE, GUARD_EH_CONT_COUNT);
    return true;
}